

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O2

int __thiscall MyObserver::on_exit(MyObserver *this,__func *__func,void *__arg)

{
  int iVar1;
  ostream *poVar2;
  string local_1b0 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"worker ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," finished running ");
  poVar2 = std::operator<<(poVar2,(string *)((long)__arg + 8));
  std::operator<<(poVar2,'\n');
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)&std::cout,local_1b0);
  std::__cxx11::string::~string(local_1b0);
  iVar1 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return iVar1;
}

Assistant:

void on_exit(tf::WorkerView wv, tf::TaskView tv) override final {
    std::ostringstream oss;
    oss << "worker " << wv.id() << " finished running " << tv.name() << '\n';
    std::cout << oss.str();
  }